

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmci.c
# Opt level: O2

Gia_Man_t *
Bmc_BmciPart(Gia_Man_t *pNew,Vec_Int_t *vSatMap,Vec_Int_t *vMiters,Vec_Int_t *vPartMap,
            Vec_Int_t *vCopies)

{
  Vec_Int_t *p;
  int nCapMin;
  uint uVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  Gia_Man_t *pPart;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  
  uVar1 = pNew->nObjs;
  Vec_IntGrow(vCopies,uVar1);
  uVar4 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  for (; uVar8 != uVar4; uVar4 = uVar4 + 1) {
    vCopies->pArray[uVar4] = 0;
  }
  vCopies->nSize = uVar1;
  iVar9 = pNew->nObjs;
  iVar2 = vSatMap->nSize;
  if (iVar2 < iVar9) {
    iVar3 = vSatMap->nCap * 2;
    nCapMin = iVar9;
    if ((iVar3 < iVar9) || (nCapMin = iVar3, vSatMap->nCap < iVar9)) {
      Vec_IntGrow(vSatMap,nCapMin);
      iVar2 = vSatMap->nSize;
    }
    for (lVar5 = (long)iVar2; lVar5 < iVar9; lVar5 = lVar5 + 1) {
      vSatMap->pArray[lVar5] = -1;
    }
    vSatMap->nSize = iVar9;
  }
  pPart = Gia_ManStart(1000);
  pcVar6 = Abc_UtilStrsav(pNew->pName);
  pPart->pName = pcVar6;
  vPartMap->nSize = 0;
  iVar9 = 0;
  Vec_IntPush(vPartMap,0);
  do {
    if (vMiters->nSize <= iVar9) {
      if (pPart->vCos->nSize <= pPart->nRegs) {
        __assert_fail("Gia_ManPoNum(pPart) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0xa0,
                      "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      if (vPartMap->nSize == pPart->nObjs) {
        return pPart;
      }
      __assert_fail("Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                    ,0xa1,
                    "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    uVar1 = Vec_IntEntry(vMiters,iVar9);
    if (uVar1 != 0xffffffff) {
      if ((int)uVar1 < 2) {
        __assert_fail("iLit >= 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bmc/bmcBmci.c"
                      ,0x9b,
                      "Gia_Man_t *Bmc_BmciPart(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                     );
      }
      iVar2 = Abc_Lit2Var(uVar1);
      iVar2 = Bmc_BmciPart_rec(pNew,vSatMap,iVar2,pPart,vPartMap,vCopies);
      uVar1 = Abc_LitNotCond(iVar2,uVar1 & 1);
      iVar2 = Abc_Lit2Var(uVar1);
      if (pPart->nObjs <= iVar2) {
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30e,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      iVar2 = Abc_Lit2Var(uVar1);
      pGVar7 = Gia_ManObj(pPart,iVar2);
      if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && (int)*(uint *)pGVar7 < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x30f,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar7 = Gia_ManAppendObj(pPart);
      pGVar7->field_0x3 = pGVar7->field_0x3 | 0x80;
      iVar2 = Gia_ObjId(pPart,pGVar7);
      iVar3 = Abc_Lit2Var(uVar1);
      uVar10 = (ulong)(iVar2 - iVar3 & 0x1fffffff);
      uVar4 = *(ulong *)pGVar7;
      uVar8 = (ulong)((uVar1 & 1) << 0x1d);
      *(ulong *)pGVar7 = uVar8 | uVar4 & 0xffffffffc0000000 | uVar10;
      *(ulong *)pGVar7 =
           uVar8 | uVar4 & 0xe0000000c0000000 | uVar10 |
           (ulong)(pPart->vCos->nSize & 0x1fffffff) << 0x20;
      p = pPart->vCos;
      iVar2 = Gia_ObjId(pPart,pGVar7);
      Vec_IntPush(p,iVar2);
      if (pPart->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(pPart,pGVar7 + -(ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff),pGVar7);
      }
      Gia_ObjId(pPart,pGVar7);
      Vec_IntPush(vPartMap,-1);
    }
    iVar9 = iVar9 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Bmc_BmciPart( Gia_Man_t * pNew, Vec_Int_t * vSatMap, Vec_Int_t * vMiters, Vec_Int_t * vPartMap, Vec_Int_t * vCopies )
{
    Gia_Man_t * pPart;
    int i, iLit, iLitPart;
    Vec_IntFill( vCopies, Gia_ManObjNum(pNew), 0 );
    Vec_IntFillExtra( vSatMap, Gia_ManObjNum(pNew), -1 );
    pPart = Gia_ManStart( 1000 );
    pPart->pName = Abc_UtilStrsav( pNew->pName );
    Vec_IntClear( vPartMap );
    Vec_IntPush( vPartMap, 0 );
    Vec_IntForEachEntry( vMiters, iLit, i )
    {
        if ( iLit == -1 )
            continue;
        assert( iLit >= 2 );
        iLitPart = Bmc_BmciPart_rec( pNew, vSatMap, Abc_Lit2Var(iLit), pPart, vPartMap, vCopies );
        Gia_ManAppendCo( pPart, Abc_LitNotCond(iLitPart, Abc_LitIsCompl(iLit)) );
        Vec_IntPush( vPartMap, -1 );
    }
    assert( Gia_ManPoNum(pPart) > 0 );
    assert( Vec_IntSize(vPartMap) == Gia_ManObjNum(pPart) );
    return pPart;
}